

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall MemoryAccountant::clear(MemoryAccountant *this)

{
  MemoryAccountant *in_RDI;
  MemoryAccountantAllocationNode *to_be_deleted;
  MemoryAccountantAllocationNode *node;
  MemoryAccountantAllocationNode *in_stack_ffffffffffffffd8;
  MemoryAccountantAllocationNode *local_10;
  
  local_10 = in_RDI->head_;
  while (local_10 != (MemoryAccountantAllocationNode *)0x0) {
    local_10 = local_10->next_;
    destroyAccountantAllocationNode(in_RDI,in_stack_ffffffffffffffd8);
  }
  in_RDI->head_ = (MemoryAccountantAllocationNode *)0x0;
  return;
}

Assistant:

void MemoryAccountant::clear()
{
    MemoryAccountantAllocationNode* node = head_;
    MemoryAccountantAllocationNode* to_be_deleted = NULLPTR;
    while (node) {
        to_be_deleted = node;
        node = node->next_;
        destroyAccountantAllocationNode(to_be_deleted);
    }
    head_ = NULLPTR;
}